

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O0

int fctkern__cl_parse(fctkern_t *nk)

{
  int iVar1;
  char *pcVar2;
  char *prefix_filter;
  char *param;
  char *err;
  size_t param_i;
  size_t num_params;
  int status;
  fctkern_t *nk_local;
  
  if (nk == (fctkern_t *)0x0) {
    nk_local._4_4_ = 0;
  }
  else {
    if ((nk->cl_user_opts == (fctcl_init_t *)0x0) ||
       (iVar1 = fct_clp__add_options(&nk->cl_parser,nk->cl_user_opts), iVar1 != 0)) {
      iVar1 = fct_clp__add_options(&nk->cl_parser,FCT_CLP_OPTIONS);
      if (iVar1 == 0) {
        num_params._4_4_ = 0;
      }
      else {
        fct_clp__parse(&nk->cl_parser,nk->cl_argc,nk->cl_argv);
        if ((nk->cl_parser).is_error == 0) {
          pcVar2 = (char *)fct_nlist__size(&(nk->cl_parser).param_list);
          for (err = (char *)0x0; err != pcVar2; err = err + 1) {
            prefix_filter = (char *)fct_nlist__at(&(nk->cl_parser).param_list,(size_t)err);
            fctkern__add_prefix_filter(nk,prefix_filter);
          }
          iVar1 = fctkern__cl_is(nk,"--version");
          if (iVar1 == 0) {
            iVar1 = fctkern__cl_is(nk,"--help");
            if (iVar1 == 0) {
              iVar1 = fctkern__cl_parse_config_logger(nk);
              if (iVar1 == 0) {
                num_params._4_4_ = -1;
              }
              else {
                num_params._4_4_ = 1;
                nk->cl_is_parsed = 1;
              }
            }
            else {
              fctkern__write_help(nk,_stdout);
              num_params._4_4_ = -1;
            }
          }
          else {
            printf("Built using FCTX version %s.\n","1.6.1");
            num_params._4_4_ = -1;
          }
        }
        else {
          fprintf(_stderr,"error: %s",(nk->cl_parser).error_msg);
          num_params._4_4_ = 0;
        }
      }
    }
    else {
      num_params._4_4_ = 0;
    }
    nk_local._4_4_ = num_params._4_4_;
  }
  return nk_local._4_4_;
}

Assistant:

static int
fctkern__cl_parse(fctkern_t *nk)
{
    int status =0;
    size_t num_params =0;
    size_t param_i =0;
    if ( nk == NULL )
    {
        return 0;
    }
    if ( nk->cl_user_opts != NULL )
    {
        if ( !fct_clp__add_options(&(nk->cl_parser), nk->cl_user_opts) )
        {
            status =0;
            goto finally;
        }
    }
    /* You want to add the "house options" after the user defined ones. The
    options are stored as a list so it means that any option listed after
    the above ones won't get parsed. */
    if ( !fct_clp__add_options(&(nk->cl_parser), FCT_CLP_OPTIONS) )
    {
        status =0;
        goto finally;
    }
    fct_clp__parse(&(nk->cl_parser), nk->cl_argc, nk->cl_argv);
    if ( fct_clp__is_error(&(nk->cl_parser)) )
    {
        char *err = fct_clp__get_error(&(nk->cl_parser));
        fprintf(stderr, "error: %s", err);
        status =0;
        goto finally;
    }
    num_params = fct_clp__param_cnt(&(nk->cl_parser));
    for ( param_i =0; param_i != num_params; ++param_i )
    {
        char const *param = fct_clp__param_at(&(nk->cl_parser), param_i);
        fctkern__add_prefix_filter(nk, param);
    }
    if ( fctkern__cl_is(nk, FCT_OPT_VERSION) )
    {
        (void)printf("Built using FCTX version %s.\n", FCT_VERSION_STR);
        status = -1;
        goto finally;
    }
    if ( fctkern__cl_is(nk, FCT_OPT_HELP) )
    {
        fctkern__write_help(nk, stdout);
        status = -1;
        goto finally;
    }
    if ( !fctkern__cl_parse_config_logger(nk) )
    {
        status = -1;
        goto finally;
    }
    status =1;
    nk->cl_is_parsed =1;
finally:
    return status;
}